

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

WhereTerm * whereScanNext(WhereScan *pScan)

{
  short sVar1;
  int iTab;
  uint uVar2;
  Parse *pParse;
  byte bVar3;
  int iVar4;
  uint uVar5;
  CollSeq *pCVar6;
  Expr *pEVar7;
  ExprList_item *pEVar8;
  long lVar9;
  ulong uVar10;
  WhereClause *pWVar11;
  WhereTerm *pWVar12;
  int iVar13;
  
  iVar13 = pScan->k;
  pWVar11 = pScan->pWC;
  bVar3 = pScan->iEquiv;
  do {
    sVar1 = pScan->aiColumn[(ulong)bVar3 - 1];
    iTab = pScan->aiCur[(ulong)bVar3 - 1];
    do {
      if (iVar13 < pWVar11->nTerm) {
        pWVar12 = pWVar11->a + iVar13;
LAB_001909a5:
        if ((((pWVar12->leftCursor == iTab) && ((pWVar12->u).x.leftColumn == (int)sVar1)) &&
            ((sVar1 != -2 ||
             (iVar4 = sqlite3ExprCompareSkip(pWVar12->pExpr->pLeft,pScan->pIdxExpr,iTab), iVar4 == 0
             )))) && ((pScan->iEquiv < 2 || ((pWVar12->pExpr->flags & 1) == 0)))) {
          uVar5._0_2_ = pWVar12->eOperator;
          uVar5._2_1_ = pWVar12->nChild;
          uVar5._3_1_ = pWVar12->eMatchOp;
          if ((uVar5 >> 0xb & 1) != 0) {
            bVar3 = pScan->nEquiv;
            if (bVar3 < 0xb) {
              pEVar7 = pWVar12->pExpr->pRight;
              while (pEVar7 != (Expr *)0x0) {
                uVar2 = pEVar7->flags;
                if ((uVar2 & 0x82000) == 0) {
                  if (((uVar2 & 0x20) == 0) && (pEVar7->op == 0xa7)) {
                    if ((ulong)bVar3 != 0) {
                      uVar10 = 0;
                      goto LAB_00190a52;
                    }
                    uVar10 = 0;
                    goto LAB_00190a71;
                  }
                  break;
                }
                if ((uVar2 >> 0x13 & 1) == 0) {
                  pEVar8 = (ExprList_item *)&pEVar7->pLeft;
                }
                else {
                  pEVar8 = ((pEVar7->x).pList)->a;
                }
                pEVar7 = pEVar8->pExpr;
              }
            }
          }
          goto LAB_00190a92;
        }
        goto LAB_00190b77;
      }
LAB_00190b88:
      pWVar11 = pWVar11->pOuter;
      iVar13 = 0;
    } while (pWVar11 != (WhereClause *)0x0);
    if (pScan->nEquiv <= pScan->iEquiv) {
      return (WhereTerm *)0x0;
    }
    pWVar11 = pScan->pOrigWC;
    bVar3 = pScan->iEquiv + 1;
    pScan->iEquiv = bVar3;
    iVar13 = 0;
  } while( true );
  while (uVar10 = uVar10 + 1, bVar3 != uVar10) {
LAB_00190a52:
    if ((pScan->aiCur[uVar10] == pEVar7->iTable) && (pScan->aiColumn[uVar10] == pEVar7->iColumn))
    goto LAB_00190a71;
  }
LAB_00190a75:
  pScan->aiCur[bVar3] = pEVar7->iTable;
  pScan->aiColumn[bVar3] = pEVar7->iColumn;
  pScan->nEquiv = bVar3 + 1;
  uVar5 = (uint)pWVar12->eOperator;
LAB_00190a92:
  if ((pScan->opMask & uVar5 & 0xffff) != 0) {
    if ((((uVar5 & 0xffff) >> 8 & 1) == 0) && (pScan->zCollName != (char *)0x0)) {
      pParse = pWVar11->pWInfo->pParse;
      pEVar7 = pWVar12->pExpr;
      iVar4 = sqlite3IndexAffinityOk(pEVar7,pScan->idxaff);
      if (iVar4 != 0) {
        uVar5 = pEVar7->flags & 0x400;
        pCVar6 = sqlite3BinaryCompareCollSeq
                           (pParse,*(Expr **)((long)&pEVar7->pLeft + (ulong)(uVar5 >> 7)),
                            (&pEVar7->pLeft)[uVar5 == 0]);
        if (pCVar6 == (CollSeq *)0x0) {
          pCVar6 = pParse->db->pDfltColl;
        }
        lVar9 = 0;
        do {
          bVar3 = pCVar6->zName[lVar9];
          if (bVar3 == pScan->zCollName[lVar9]) {
            if ((ulong)bVar3 == 0) goto LAB_00190b4b;
          }
          else if (""[bVar3] != ""[(byte)pScan->zCollName[lVar9]]) break;
          lVar9 = lVar9 + 1;
        } while( true );
      }
    }
    else {
LAB_00190b50:
      if (((((uVar5 & 0x82) == 0) || (pEVar7 = pWVar12->pExpr->pRight, pEVar7 == (Expr *)0x0)) ||
          (pEVar7->op != 0xa7)) ||
         ((pEVar7->iTable != pScan->aiCur[0] || (pEVar7->iColumn != pScan->aiColumn[0])))) {
        pScan->pWC = pWVar11;
        pScan->k = iVar13 + 1;
        return pWVar12;
      }
    }
  }
LAB_00190b77:
  iVar13 = iVar13 + 1;
  pWVar12 = pWVar12 + 1;
  if (pWVar11->nTerm <= iVar13) goto LAB_00190b88;
  goto LAB_001909a5;
LAB_00190a71:
  if ((uint)uVar10 == (uint)bVar3) goto LAB_00190a75;
  goto LAB_00190a92;
LAB_00190b4b:
  uVar5 = (uint)pWVar12->eOperator;
  goto LAB_00190b50;
}

Assistant:

static WhereTerm *whereScanNext(WhereScan *pScan){
  int iCur;            /* The cursor on the LHS of the term */
  i16 iColumn;         /* The column on the LHS of the term.  -1 for IPK */
  Expr *pX;            /* An expression being tested */
  WhereClause *pWC;    /* Shorthand for pScan->pWC */
  WhereTerm *pTerm;    /* The term being tested */
  int k = pScan->k;    /* Where to start scanning */

  assert( pScan->iEquiv<=pScan->nEquiv );
  pWC = pScan->pWC;
  while(1){
    iColumn = pScan->aiColumn[pScan->iEquiv-1];
    iCur = pScan->aiCur[pScan->iEquiv-1];
    assert( pWC!=0 );
    assert( iCur>=0 );
    do{
      for(pTerm=pWC->a+k; k<pWC->nTerm; k++, pTerm++){
        assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 || pTerm->leftCursor<0 );
        if( pTerm->leftCursor==iCur
         && pTerm->u.x.leftColumn==iColumn
         && (iColumn!=XN_EXPR
             || sqlite3ExprCompareSkip(pTerm->pExpr->pLeft,
                                       pScan->pIdxExpr,iCur)==0)
         && (pScan->iEquiv<=1 || !ExprHasProperty(pTerm->pExpr, EP_OuterON))
        ){
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && pScan->nEquiv<ArraySize(pScan->aiCur)
           && (pX = whereRightSubexprIsColumn(pTerm->pExpr))!=0
          ){
            int j;
            for(j=0; j<pScan->nEquiv; j++){
              if( pScan->aiCur[j]==pX->iTable
               && pScan->aiColumn[j]==pX->iColumn ){
                  break;
              }
            }
            if( j==pScan->nEquiv ){
              pScan->aiCur[j] = pX->iTable;
              pScan->aiColumn[j] = pX->iColumn;
              pScan->nEquiv++;
            }
          }
          if( (pTerm->eOperator & pScan->opMask)!=0 ){
            /* Verify the affinity and collating sequence match */
            if( pScan->zCollName && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              Parse *pParse = pWC->pWInfo->pParse;
              pX = pTerm->pExpr;
              if( !sqlite3IndexAffinityOk(pX, pScan->idxaff) ){
                continue;
              }
              assert(pX->pLeft);
              pColl = sqlite3ExprCompareCollSeq(pParse, pX);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
              if( sqlite3StrICmp(pColl->zName, pScan->zCollName) ){
                continue;
              }
            }
            if( (pTerm->eOperator & (WO_EQ|WO_IS))!=0
             && (pX = pTerm->pExpr->pRight, ALWAYS(pX!=0))
             && pX->op==TK_COLUMN
             && pX->iTable==pScan->aiCur[0]
             && pX->iColumn==pScan->aiColumn[0]
            ){
              testcase( pTerm->eOperator & WO_IS );
              continue;
            }
            pScan->pWC = pWC;
            pScan->k = k+1;
#ifdef WHERETRACE_ENABLED
            if( sqlite3WhereTrace & 0x20000 ){
              int ii;
              sqlite3DebugPrintf("SCAN-TERM %p: nEquiv=%d",
                 pTerm, pScan->nEquiv);
              for(ii=0; ii<pScan->nEquiv; ii++){
                sqlite3DebugPrintf(" {%d:%d}",
                   pScan->aiCur[ii], pScan->aiColumn[ii]);
              }
              sqlite3DebugPrintf("\n");
            }
#endif
            return pTerm;
          }
        }
      }
      pWC = pWC->pOuter;
      k = 0;
    }while( pWC!=0 );
    if( pScan->iEquiv>=pScan->nEquiv ) break;
    pWC = pScan->pOrigWC;
    k = 0;
    pScan->iEquiv++;
  }
  return 0;
}